

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateImageVariableToSampledImage
          (ConvertToSampledImagePass *this,Instruction *image_variable,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  Instruction *this_00;
  bool bVar1;
  uint32_t ty_id;
  reference ppIVar2;
  Instruction *image_extraction_00;
  Instruction *image_extraction;
  Instruction *load;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  uint32_t sampled_image_type_id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  image_variable_loads;
  DescriptorSetAndBinding *descriptor_set_binding_local;
  Instruction *image_variable_local;
  ConvertToSampledImagePass *this_local;
  
  image_variable_loads.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descriptor_set_binding;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &sampled_image_type_id);
  FindUses(this,image_variable,
           (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
           &sampled_image_type_id,OpLoad);
  bVar1 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&sampled_image_type_id);
  if (bVar1) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    ty_id = GetSampledImageTypeForImage(this,image_variable);
    if (ty_id == 0) {
      this_local._4_4_ = Failure;
    }
    else {
      __end2 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&sampled_image_type_id);
      load = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&sampled_image_type_id);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                         *)&load), bVar1) {
        ppIVar2 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end2);
        this_00 = *ppIVar2;
        opt::Instruction::SetResultType(this_00,ty_id);
        image_extraction_00 = UpdateImageUses(this,this_00);
        UpdateSampledImageUses
                  (this,this_00,image_extraction_00,
                   (DescriptorSetAndBinding *)
                   image_variable_loads.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end2);
      }
      bVar1 = ConvertImageVariableToSampledImage(this,image_variable,ty_id);
      this_local._4_4_ = Failure;
      if (bVar1) {
        this_local._4_4_ = SuccessWithChange;
      }
    }
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &sampled_image_type_id);
  return this_local._4_4_;
}

Assistant:

Pass::Status ConvertToSampledImagePass::UpdateImageVariableToSampledImage(
    Instruction* image_variable,
    const DescriptorSetAndBinding& descriptor_set_binding) {
  std::vector<Instruction*> image_variable_loads;
  FindUses(image_variable, &image_variable_loads, spv::Op::OpLoad);
  if (image_variable_loads.empty()) return Status::SuccessWithoutChange;

  const uint32_t sampled_image_type_id =
      GetSampledImageTypeForImage(image_variable);
  if (!sampled_image_type_id) return Status::Failure;

  for (auto* load : image_variable_loads) {
    load->SetResultType(sampled_image_type_id);
    auto* image_extraction = UpdateImageUses(load);
    UpdateSampledImageUses(load, image_extraction, descriptor_set_binding);
  }

  return ConvertImageVariableToSampledImage(image_variable,
                                            sampled_image_type_id)
             ? Status::SuccessWithChange
             : Status::Failure;
}